

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O2

void __thiscall libtorrent::http_stream::handshake2(http_stream *this,error_code *e,handler_type *h)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  _Manager_type p_Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  mutable_buffers_1 local_78;
  undefined1 local_68 [16];
  _Any_data local_58;
  _Manager_type p_Stack_48;
  _Invoker_type local_40;
  _Head_base<0UL,_libtorrent::http_stream_*,_false> local_38;
  
  local_68._1_15_ = local_68._8_15_;
  bVar4 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar4) {
    this_00 = &this->m_buffer;
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    if (((uVar7 < 3) || (pcVar1[uVar7 - 1] != '\n')) ||
       ((pcVar1[uVar7 - 2] != '\n' &&
        (((pcVar1[uVar7 - 2] != '\r' || uVar7 < 5 || (pcVar1[uVar7 - 3] != '\n')) ||
         (pcVar1[uVar7 - 4] != '\r')))))) {
      std::vector<char,_std::allocator<char>_>::resize(this_00,uVar7 + 1);
      local_78.super_mutable_buffer.data_ =
           (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar7;
      local_78.super_mutable_buffer.size_ = 1;
      local_68 = ZEXT816(0x1c9960);
      local_58._M_unused._M_object = (pointer)0x0;
      local_58._8_8_ = 0;
      p_Stack_48 = (_Manager_type)0x0;
      local_40 = h->_M_invoker;
      p_Var2 = (h->super__Function_base)._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(h->super__Function_base)._M_functor;
        local_58._8_8_ = *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
        (h->super__Function_base)._M_manager = (_Manager_type)0x0;
        h->_M_invoker = (_Invoker_type)0x0;
        p_Stack_48 = p_Var2;
      }
      local_38._M_head_impl = this;
      boost::asio::
      async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)this,&local_78,
                 (_Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
                  *)local_68,(type *)0x0);
      std::_Function_base::~_Function_base((_Function_base *)&local_58);
    }
    else {
      auVar3[0xf] = 0;
      auVar3._0_15_ = local_68._1_15_;
      local_68 = auVar3 << 8;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,local_68);
      pcVar6 = strchr((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,0x20);
      if ((pcVar6 != (char *)0x0) && (iVar5 = atoi(pcVar6 + 1), iVar5 == 200)) {
        std::function<void_(const_boost::system::error_code_&)>::operator()(h,e);
        local_68 = *(undefined1 (*) [16])
                    &(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data;
        local_58._M_unused._M_object =
             (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)local_68);
        return;
      }
      local_68 = (undefined1  [16])boost::asio::error::make_error_code(operation_not_supported);
      std::function<void_(const_boost::system::error_code_&)>::operator()(h,(error_code *)local_68);
      local_68._0_8_ = local_68._5_8_ << 0x28;
      local_68._8_8_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      close(this,(int)local_68);
    }
  }
  return;
}

Assistant:

void http_stream::handshake2(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1)
			, std::bind(&http_stream::handshake2, this, _1, std::move(h)));
	}